

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O1

int __thiscall
bdConnectManager::cleanConnection
          (bdConnectManager *this,bdNodeId *srcId,bdNodeId *proxyId,bdNodeId *destId)

{
  iterator __position;
  bool bVar1;
  bdProxyTuple tuple;
  bdConnection conn;
  key_type local_158;
  bdConnection local_110;
  
  local_158.srcId.data._16_4_ = *(undefined4 *)(srcId->data + 0x10);
  local_158.srcId.data._0_8_ = *(undefined8 *)srcId->data;
  local_158.srcId.data._8_8_ = *(undefined8 *)(srcId->data + 8);
  local_158.proxyId.data._0_8_ = *(undefined8 *)proxyId->data;
  local_158.proxyId.data._8_8_ = *(undefined8 *)(proxyId->data + 8);
  local_158.proxyId.data._16_4_ = *(undefined4 *)(proxyId->data + 0x10);
  local_158.destId.data._0_8_ = *(undefined8 *)destId->data;
  local_158.destId.data._8_8_ = *(undefined8 *)(destId->data + 8);
  local_158.destId.data._16_4_ = *(undefined4 *)(destId->data + 0x10);
  bdConnection::bdConnection(&local_110);
  __position = std::
               _Rb_tree<bdProxyTuple,_std::pair<const_bdProxyTuple,_bdConnection>,_std::_Select1st<std::pair<const_bdProxyTuple,_bdConnection>_>,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
               ::find(&(this->mConnections)._M_t,&local_158);
  bVar1 = (_Rb_tree_header *)__position._M_node ==
          &(this->mConnections)._M_t._M_impl.super__Rb_tree_header;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bdConnectManager::cleanConnection() ERROR Removing: ",0x34);
    operator<<((ostream *)&std::cerr,&local_158);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  else {
    std::
    _Rb_tree<bdProxyTuple,std::pair<bdProxyTuple_const,bdConnection>,std::_Select1st<std::pair<bdProxyTuple_const,bdConnection>>,std::less<bdProxyTuple>,std::allocator<std::pair<bdProxyTuple_const,bdConnection>>>
    ::erase_abi_cxx11_((_Rb_tree<bdProxyTuple,std::pair<bdProxyTuple_const,bdConnection>,std::_Select1st<std::pair<bdProxyTuple_const,bdConnection>>,std::less<bdProxyTuple>,std::allocator<std::pair<bdProxyTuple_const,bdConnection>>>
                        *)&this->mConnections,__position);
  }
  return (uint)!bVar1;
}

Assistant:

int bdConnectManager::cleanConnection(bdNodeId *srcId, bdNodeId *proxyId, bdNodeId *destId) {
	bdProxyTuple tuple(srcId, proxyId, destId);
	bdConnection conn;
#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::cleanConnection() Removing: " << tuple << std::endl;
#endif
	std::map<bdProxyTuple, bdConnection>::iterator it = mConnections.find(tuple);
	if (it == mConnections.end()) {
		std::cerr << "bdConnectManager::cleanConnection() ERROR Removing: " << tuple << std::endl;
		return 0;
	}
	mConnections.erase(it);

	return 1;
}